

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_spec_tests.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  UnitTestSource *pUVar3;
  TestFlag *pTVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char **in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  AssertionResult iutest_ar_1;
  AssertionResult iutest_ar;
  int targc;
  char *targv [2];
  allocator<char> local_3dd;
  int local_3dc;
  AssertionResult local_3d8;
  int local_3ac;
  AssertionHelper local_3a8;
  int local_374;
  char **local_370;
  undefined1 local_368 [392];
  int local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 local_1b8 [32];
  char *local_198;
  undefined8 local_190;
  ios_base aiStack_138 [264];
  
  iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = &logger;
  local_374 = 2;
  local_1d8 = *argv;
  local_1d0 = "--feature";
  local_370 = argv;
  pUVar3 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar3);
  iutest::TestEnv::ParseCommandLine<char_const>(&local_374,&local_1d8);
  iutest::TestEnv::LoadFlagFile();
  pUVar3 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar3);
  pTVar4 = iutest::TestFlag::GetInstance();
  uVar5 = pTVar4->m_test_flags & 0x4000000;
  paVar8 = &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2;
  local_3a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_3a8.m_part_result.super_iuCodeMessage.m_file =
       (char *)CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_file._1_7_,
                        (byte)(uVar5 >> 0x1a));
  local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar8;
  if (uVar5 == 0) {
    memset((iu_global_format_stringstream *)local_368,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_3d8.m_message,(internal *)&local_3a8,
               (AssertionResult *)
               "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false","true",
               (char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_190 = 0x100000032;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
  }
  logger.m_log._M_string_length = 0;
  *logger.m_log._M_dataplus._M_p = '\0';
  pUVar3 = iutest::UnitTestSource::GetInstance();
  local_3ac = iutest::UnitTestSource::Run(pUVar3);
  local_368._0_8_ = logger.m_log._M_dataplus._M_p;
  iuutil::StrInHelper::Assertion<char[24],char_const*>
            (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
             "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
  bVar1 = local_3d8.m_result;
  iVar6 = 0;
  if (local_3d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuStreamMessage::iuStreamMessage
              ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
    local_1e0 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x36;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_368,false);
    iVar6 = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(aiStack_138);
  }
  paVar8 = &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
    operator_delete(local_3d8.m_message._M_dataplus._M_p,
                    local_3d8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar1 != false) {
    local_368._0_8_ = logger.m_log._M_dataplus._M_p;
    iuutil::StrNotInHelper::Assertion<char[17],char_const*>
              (&local_3d8,(StrNotInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
               "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
    bVar1 = local_3d8.m_result;
    iVar7 = iVar6;
    if (local_3d8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
      local_1e0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
      local_3a8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
      ;
      local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x37;
      local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_368,false);
      local_3dc = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8) {
        operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
      std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      iVar7 = local_3dc;
    }
    paVar9 = &local_3d8.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    iVar6 = iVar7;
    if ((bVar1 != false) && (iVar6 = 1, local_3ac == 0)) {
      local_374 = 2;
      local_1d8 = *local_370;
      local_1d0 = "--spec";
      pUVar3 = iutest::UnitTestSource::GetInstance();
      iutest::UnitTestSource::Initialize(pUVar3);
      iutest::TestEnv::ParseCommandLine<char_const>(&local_374,&local_1d8);
      iutest::TestEnv::LoadFlagFile();
      pUVar3 = iutest::UnitTestSource::GetInstance();
      iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar3);
      pTVar4 = iutest::TestFlag::GetInstance();
      uVar5 = pTVar4->m_test_flags & 0x8000000;
      local_3a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
      local_3a8.m_part_result.super_iuCodeMessage.m_file =
           (char *)CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_file._1_7_,
                            (byte)(uVar5 >> 0x1b));
      local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar8;
      if (uVar5 == 0) {
        memset((iu_global_format_stringstream *)local_368,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_368);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  (&local_3d8.m_message,(internal *)&local_3a8,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","false","true",
                   (char *)in_R9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
        local_198 = 
        "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
        ;
        local_190 = 0x100000040;
        iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
          operator_delete(local_3d8.m_message._M_dataplus._M_p,
                          local_3d8.m_message.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
        std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8) {
          operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                   _M_local_buf[0]) + 1);
        }
      }
      logger.m_log._M_string_length = 0;
      *logger.m_log._M_dataplus._M_p = '\0';
      pUVar3 = iutest::UnitTestSource::GetInstance();
      local_3ac = iutest::UnitTestSource::Run(pUVar3);
      local_368._0_8_ = logger.m_log._M_dataplus._M_p;
      iuutil::StrNotInHelper::Assertion<char[24],char_const*>
                (&local_3d8,(StrNotInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
                 "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
      bVar1 = local_3d8.m_result;
      if (local_3d8.m_result == false) {
        memset((iu_global_format_stringstream *)local_1b8,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1b8);
        iutest::detail::iuStreamMessage::iuStreamMessage
                  ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
        local_1e0 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
        local_3a8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
        ;
        local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x44;
        local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_368,false);
        local_3dc = local_1e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8) {
          operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                   _M_allocated_capacity._1_7_,
                                   local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                   _M_local_buf[0]) + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
        std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(aiStack_138);
        iVar7 = local_3dc;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
        operator_delete(local_3d8.m_message._M_dataplus._M_p,
                        local_3d8.m_message.field_2._M_allocated_capacity + 1);
      }
      iVar6 = iVar7;
      if (bVar1 != false) {
        local_368._0_8_ = logger.m_log._M_dataplus._M_p;
        iuutil::StrInHelper::Assertion<char[17],char_const*>
                  (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
                   "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
        bVar1 = local_3d8.m_result;
        if (local_3d8.m_result == false) {
          memset((iu_global_format_stringstream *)local_1b8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_1b8);
          iutest::detail::iuStreamMessage::iuStreamMessage
                    ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
          local_1e0 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
          local_3a8.m_part_result.super_iuCodeMessage.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
          ;
          local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x45;
          local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
          iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_368,false);
          local_3dc = local_1e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8) {
            operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                            CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                                     _M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
          std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(aiStack_138);
          iVar7 = local_3dc;
        }
        paVar9 = &local_3d8.m_message.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
          operator_delete(local_3d8.m_message._M_dataplus._M_p,
                          local_3d8.m_message.field_2._M_allocated_capacity + 1);
        }
        iVar6 = iVar7;
        if ((bVar1 != false) && (iVar6 = 1, local_3ac == 0)) {
          local_374 = 3;
          local_1d8 = *local_370;
          local_1d0 = "--feature";
          local_1c8 = "--spec";
          pUVar3 = iutest::UnitTestSource::GetInstance();
          iutest::UnitTestSource::Initialize(pUVar3);
          iutest::TestEnv::ParseCommandLine<char_const>(&local_374,&local_1d8);
          iutest::TestEnv::LoadFlagFile();
          pUVar3 = iutest::UnitTestSource::GetInstance();
          iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar3);
          pTVar4 = iutest::TestFlag::GetInstance();
          uVar5 = pTVar4->m_test_flags & 0x4000000;
          local_3a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
          local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
          bVar2 = (byte)(uVar5 >> 0x1a);
          local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar8;
          local_3a8.m_part_result.super_iuCodeMessage.m_file._0_1_ = bVar2;
          if (uVar5 == 0) {
            memset((iu_global_format_stringstream *)local_368,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      (&local_3d8.m_message,(internal *)&local_3a8,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false",
                       "true",(char *)in_R9);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
            local_198 = 
            "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
            ;
            local_190 = 0x10000004e;
            iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
              operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
              operator_delete(local_3d8.m_message._M_dataplus._M_p,
                              local_3d8.m_message.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
            std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8)
            {
              operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ,CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity._1_7_,
                                        local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[0]) + 1);
            }
          }
          pTVar4 = iutest::TestFlag::GetInstance();
          uVar5 = pTVar4->m_test_flags & 0x8000000;
          local_3a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
          local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
          local_3a8.m_part_result.super_iuCodeMessage.m_file =
               (char *)CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_file._1_7_,
                                (byte)(uVar5 >> 0x1b));
          local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar8;
          if (uVar5 == 0) {
            memset((iu_global_format_stringstream *)local_368,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      (&local_3d8.m_message,(internal *)&local_3a8,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","false",
                       "true",(char *)in_R9);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
            local_198 = 
            "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
            ;
            local_190 = 0x10000004f;
            iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
              operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
              operator_delete(local_3d8.m_message._M_dataplus._M_p,
                              local_3d8.m_message.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
            std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8)
            {
              operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ,CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity._1_7_,
                                        local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[0]) + 1);
            }
          }
          logger.m_log._M_string_length = 0;
          *logger.m_log._M_dataplus._M_p = '\0';
          local_3dc = iVar7;
          pUVar3 = iutest::UnitTestSource::GetInstance();
          local_3ac = iutest::UnitTestSource::Run(pUVar3);
          local_368._0_8_ = logger.m_log._M_dataplus._M_p;
          iuutil::StrInHelper::Assertion<char[24],char_const*>
                    (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
                     "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
          bVar1 = local_3d8.m_result;
          if (local_3d8.m_result == false) {
            memset((iu_global_format_stringstream *)local_1b8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1b8);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
            local_1e0 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
            local_3a8.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
            ;
            local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x53;
            local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
            iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_368,false);
            local_3dc = local_1e0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar8)
            {
              operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ,CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity._1_7_,
                                        local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
            std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(aiStack_138);
          }
          paVar9 = &local_3d8.m_message.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
            operator_delete(local_3d8.m_message._M_dataplus._M_p,
                            local_3d8.m_message.field_2._M_allocated_capacity + 1);
          }
          iVar6 = local_3dc;
          if (bVar1 != false) {
            local_368._0_8_ = logger.m_log._M_dataplus._M_p;
            iuutil::StrInHelper::Assertion<char[17],char_const*>
                      (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
                       "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
            if (local_3d8.m_result == false) {
              memset((iu_global_format_stringstream *)local_1b8,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_1b8);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
              local_1e0 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3a8,local_3d8.m_message._M_dataplus._M_p,&local_3dd);
              local_3a8.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
              ;
              local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x54;
              local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
              iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_368,false);
              local_3dc = local_1e0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                  paVar8) {
                operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p,CONCAT71(local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                              field_2._M_allocated_capacity._1_7_,
                                              local_3a8.m_part_result.super_iuCodeMessage.m_message.
                                              field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
              std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(aiStack_138);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.m_message._M_dataplus._M_p != paVar9) {
              operator_delete(local_3d8.m_message._M_dataplus._M_p,
                              local_3d8.m_message.field_2._M_allocated_capacity + 1);
            }
            iVar6 = local_3dc;
            if ((local_3d8.m_result != false) && (iVar6 = 1, local_3ac == 0)) {
              puts("*** Successful ***");
              iVar6 = 0;
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
    (void)argv;
#if !defined(IUTEST_USE_GTEST)
    ::iutest::detail::iuConsole::SetLogger(&logger);

    {
        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 3;
        DECAL_ARGV2("--feature", "--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}